

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

int apply_ac(OBJ_DATA *obj,int iWear,int type)

{
  int type_local;
  int iWear_local;
  OBJ_DATA *obj_local;
  int local_4;
  
  if (obj->item_type == 9) {
    switch(iWear) {
    case 1:
      local_4 = obj->value[type];
      break;
    case 2:
      local_4 = obj->value[type];
      break;
    case 3:
      local_4 = obj->value[type];
      break;
    case 4:
      local_4 = obj->value[type];
      break;
    case 5:
      local_4 = obj->value[type] * 3;
      break;
    case 6:
      local_4 = obj->value[type];
      break;
    case 7:
      local_4 = obj->value[type];
      break;
    case 8:
      local_4 = obj->value[type];
      break;
    case 9:
      local_4 = obj->value[type];
      break;
    case 10:
      local_4 = obj->value[type];
      break;
    case 0xb:
      local_4 = obj->value[type];
      break;
    case 0xc:
      local_4 = obj->value[type] << 1;
      break;
    case 0xd:
      local_4 = obj->value[type];
      break;
    case 0xe:
      local_4 = obj->value[type];
      break;
    case 0xf:
      local_4 = obj->value[type];
      break;
    default:
      local_4 = 0;
      break;
    case 0x11:
      local_4 = obj->value[type];
      break;
    case 0x14:
      local_4 = obj->value[type];
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int apply_ac(OBJ_DATA *obj, int iWear, int type)
{
	if (obj->item_type != ITEM_ARMOR)
		return 0;

	switch (iWear)
	{
		case WEAR_STRAPPED:
			return obj->value[type];
		case WEAR_BODY:
			return 3 * obj->value[type];
		case WEAR_HEAD:
			return obj->value[type];
		case WEAR_LEGS:
			return obj->value[type];
		case WEAR_FEET:
			return obj->value[type];
		case WEAR_HANDS:
			return obj->value[type];
		case WEAR_ARMS:
			return obj->value[type];
		case WEAR_SHIELD:
			return obj->value[type];
		case WEAR_NECK_1:
			return obj->value[type];
		case WEAR_NECK_2:
			return obj->value[type];
		case WEAR_ABOUT:
			return 2 * obj->value[type];
		case WEAR_WAIST:
			return obj->value[type];
		case WEAR_WRIST_L:
			return obj->value[type];
		case WEAR_WRIST_R:
			return obj->value[type];
		case WEAR_HOLD:
			return obj->value[type];
		case WEAR_FINGER_L:
			return obj->value[type];
		case WEAR_FINGER_R:
			return obj->value[type];
	}

	return 0;
}